

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_layout_helper.cc
# Opt level: O2

FieldFamily
google::protobuf::compiler::cpp::MessageLayoutHelper::GetFieldFamily
          (FieldDescriptor *field,Options *options,MessageSCCAnalyzer *scc_analyzer)

{
  bool bVar1;
  FieldFamily FVar2;
  
  bVar1 = FieldDescriptor::is_repeated(field);
  if (bVar1) {
    bVar1 = ShouldSplit(field,options);
    FVar2 = (uint)bVar1 << 2;
  }
  else if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 9) {
    FVar2 = STRING;
  }
  else if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10) {
    FVar2 = MESSAGE;
  }
  else {
    bVar1 = CanInitializeByZeroing(field,options,scc_analyzer);
    FVar2 = OTHER - bVar1;
  }
  return FVar2;
}

Assistant:

MessageLayoutHelper::FieldFamily MessageLayoutHelper::GetFieldFamily(
    const FieldDescriptor* field, const Options& options,
    MessageSCCAnalyzer* scc_analyzer) {
  if (field->is_repeated()) {
    return ShouldSplit(field, options) ? OTHER : REPEATED;
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
    return STRING;
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    return MESSAGE;
  } else if (CanInitializeByZeroing(field, options, scc_analyzer)) {
    return ZERO_INITIALIZABLE;
  } else {
    return OTHER;
  }
}